

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_pshuflw_xmm_x86_64(ZMMReg *d,ZMMReg *s,int order)

{
  uint16_t local_60;
  uint16_t local_5e;
  uint16_t local_5c;
  uint16_t local_5a;
  ZMMReg r;
  ZMMReg *pZStack_18;
  int order_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  
  local_60 = s->_w_ZMMReg[(int)(order & 3)];
  local_5e = s->_w_ZMMReg[(int)(order >> 2 & 3)];
  local_5c = s->_w_ZMMReg[(int)(order >> 4 & 3)];
  local_5a = s->_w_ZMMReg[(int)(order >> 6 & 3)];
  r._q_ZMMReg[0] = s->_q_ZMMReg[1];
  r._l_ZMMReg[0xf] = order;
  pZStack_18 = s;
  s_local = d;
  memcpy(d,&local_60,0x40);
  return;
}

Assistant:

void glue(helper_pshuflw, SUFFIX)(Reg *d, Reg *s, int order)
{
    Reg r;

    r.W(0) = s->W(order & 3);
    r.W(1) = s->W((order >> 2) & 3);
    r.W(2) = s->W((order >> 4) & 3);
    r.W(3) = s->W((order >> 6) & 3);
    r.Q(1) = s->Q(1);
    *d = r;
}